

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_max_s_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  sVar2 = *(short *)pfVar1;
  sVar3 = *(short *)((long)pfVar1 + 2);
  sVar4 = *(short *)((long)pfVar1 + 4);
  sVar5 = *(short *)((long)pfVar1 + 6);
  sVar6 = *(short *)((long)pfVar1 + 8);
  sVar7 = *(short *)((long)pfVar1 + 10);
  sVar8 = *(short *)((long)pfVar1 + 0xc);
  sVar9 = *(short *)((long)pfVar1 + 0xe);
  pfVar1 = (env->active_fpu).fpr + wt;
  sVar10 = *(short *)pfVar1;
  sVar11 = *(short *)((long)pfVar1 + 2);
  sVar12 = *(short *)((long)pfVar1 + 4);
  sVar13 = *(short *)((long)pfVar1 + 6);
  sVar14 = *(short *)((long)pfVar1 + 8);
  sVar15 = *(short *)((long)pfVar1 + 10);
  sVar16 = *(short *)((long)pfVar1 + 0xc);
  sVar17 = *(short *)((long)pfVar1 + 0xe);
  pfVar1 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar1 = (ushort)(sVar10 < sVar2) * sVar2 | (ushort)(sVar10 >= sVar2) * sVar10;
  *(ushort *)((long)pfVar1 + 2) =
       (ushort)(sVar11 < sVar3) * sVar3 | (ushort)(sVar11 >= sVar3) * sVar11;
  *(ushort *)((long)pfVar1 + 4) =
       (ushort)(sVar12 < sVar4) * sVar4 | (ushort)(sVar12 >= sVar4) * sVar12;
  *(ushort *)((long)pfVar1 + 6) =
       (ushort)(sVar13 < sVar5) * sVar5 | (ushort)(sVar13 >= sVar5) * sVar13;
  *(ushort *)((long)pfVar1 + 8) =
       (ushort)(sVar14 < sVar6) * sVar6 | (ushort)(sVar14 >= sVar6) * sVar14;
  *(ushort *)((long)pfVar1 + 10) =
       (ushort)(sVar15 < sVar7) * sVar7 | (ushort)(sVar15 >= sVar7) * sVar15;
  *(ushort *)((long)pfVar1 + 0xc) =
       (ushort)(sVar16 < sVar8) * sVar8 | (ushort)(sVar16 >= sVar8) * sVar16;
  *(ushort *)((long)pfVar1 + 0xe) =
       (ushort)(sVar17 < sVar9) * sVar9 | (ushort)(sVar17 >= sVar9) * sVar17;
  return;
}

Assistant:

void helper_msa_max_s_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_max_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_max_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_max_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_max_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_max_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_max_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_max_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_max_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}